

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O2

Seq __thiscall xt::LSeq::next(LSeq *this)

{
  long lVar1;
  LSeq *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  Seq SVar2;
  __shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  lVar1 = *(long *)(in_RSI + 8);
  if (*(long *)(lVar1 + 0x28) == 0) {
    (this->super_ISeq)._vptr_ISeq = (_func_int **)0x0;
    (this->l).super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
  }
  else {
    this_00 = (LSeq *)operator_new(0x18);
    std::__shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,(__shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2> *)(lVar1 + 0x28));
    LSeq(this_00,(List *)&local_30);
    std::__shared_ptr<xt::ISeq,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<xt::LSeq,void>
              ((__shared_ptr<xt::ISeq,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    in_RDX._M_pi = extraout_RDX;
  }
  SVar2.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  SVar2.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_ISeq;
  return (Seq)SVar2.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Seq LSeq::next() const { if (l->rest) return Seq(new LSeq(l->rest)); return Seq(); }